

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Document::parseDirectives(Document *this)

{
  size_type *psVar1;
  pointer pcVar2;
  TokenKind TVar3;
  bool bVar4;
  Token *pTVar5;
  bool bVar6;
  Token T;
  
  psVar1 = &T.Value._M_string_length;
  bVar6 = false;
  do {
    pTVar5 = Scanner::peekNext((Scanner *)
                               (this->stream->scanner)._M_t.
                               super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                               .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    TVar3 = pTVar5->Kind;
    T.Kind = *(TokenKind *)&(pTVar5->Range).Data;
    T._4_4_ = *(undefined4 *)((long)&(pTVar5->Range).Data + 4);
    T.Range.Data = (char *)(pTVar5->Range).Length;
    pcVar2 = (pTVar5->Value)._M_dataplus._M_p;
    T.Range.Length = (size_t)psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&T.Range.Length,pcVar2,pcVar2 + (pTVar5->Value)._M_string_length);
    if (TVar3 == TK_VersionDirective) {
      bVar6 = true;
      parseYAMLDirective(this);
      bVar4 = true;
    }
    else if (TVar3 == TK_TagDirective) {
      bVar6 = true;
      parseTAGDirective(this);
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
    if ((size_type *)T.Range.Length != psVar1) {
      operator_delete((void *)T.Range.Length,T.Value._M_string_length + 1);
    }
  } while (bVar4);
  return bVar6;
}

Assistant:

bool Document::parseDirectives() {
  bool isDirective = false;
  while (true) {
    Token T = peekNext();
    if (T.Kind == Token::TK_TagDirective) {
      parseTAGDirective();
      isDirective = true;
    } else if (T.Kind == Token::TK_VersionDirective) {
      parseYAMLDirective();
      isDirective = true;
    } else
      break;
  }
  return isDirective;
}